

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

LY_ERR lysp_load_module_check(ly_ctx *ctx,lysp_module *mod,lysp_submodule *submod,void *data)

{
  char *__s2;
  lysp_revision *__s2_00;
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  byte bVar4;
  char *pcVar5;
  
  if (mod == (lysp_module *)0x0) {
    ppcVar2 = &submod->name;
    bVar4 = (byte)submod->field_0x79 >> 2 & 3;
    mod = (lysp_module *)submod;
  }
  else {
    bVar4 = mod->mod->latest_revision;
    ppcVar2 = &mod->mod->name;
  }
  __s2 = *ppcVar2;
  __s2_00 = ((lysp_submodule *)mod)->revs;
  pcVar5 = *data;
  if (((lysp_revision *)pcVar5 != (lysp_revision *)0x0) && (iVar1 = strcmp(pcVar5,__s2), iVar1 != 0)
     ) {
    pcVar3 = "Unexpected module \"%s\" parsed instead of \"%s\").";
    goto LAB_00161890;
  }
  if (*(char **)((long)data + 8) != (char *)0x0) {
    if (__s2_00 == (lysp_revision *)0x0) {
      pcVar5 = "none";
    }
    else {
      iVar1 = strcmp(*(char **)((long)data + 8),__s2_00->date);
      pcVar5 = __s2_00->date;
      if (iVar1 == 0) goto LAB_0016180d;
    }
    pcVar3 = "Module \"%s\" parsed with the wrong revision (\"%s\" instead \"%s\").";
LAB_00161890:
    ly_log(ctx,LY_LLERR,LY_EINVAL,pcVar3,__s2,pcVar5);
    return LY_EINVAL;
  }
  if (bVar4 == 0) {
    return LY_EEXIST;
  }
LAB_0016180d:
  if (submod != (lysp_submodule *)0x0) {
    pcVar5 = *(char **)((long)data + 0x18);
    if (pcVar5 == (char *)0x0) {
      __assert_fail("info->submoduleof",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_common.c"
                    ,0x2d7,
                    "LY_ERR lysp_load_module_check(const struct ly_ctx *, struct lysp_module *, struct lysp_submodule *, void *)"
                   );
    }
    pcVar3 = submod->mod->name;
    iVar1 = strcmp(pcVar5,pcVar3);
    if (iVar1 == 0) {
      if ((submod->field_0x79 & 1) == 0) goto LAB_001618b6;
      ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"A circular dependency (include) for module \"%s\".",
              submod->name);
    }
    else {
      ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
              "Included \"%s\" submodule from \"%s\" belongs-to a different module \"%s\".",
              submod->name,pcVar5,pcVar3);
    }
    return LY_EVALID;
  }
LAB_001618b6:
  if (*(char **)((long)data + 0x10) == (char *)0x0) {
    return LY_SUCCESS;
  }
  ly_check_module_filename(ctx,__s2,__s2_00->date,*(char **)((long)data + 0x10));
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lysp_load_module_check(const struct ly_ctx *ctx, struct lysp_module *mod, struct lysp_submodule *submod, void *data)
{
    struct lysp_load_module_check_data *info = data;
    const char *name;
    uint8_t latest_revision;
    struct lysp_revision *revs;

    name = mod ? mod->mod->name : submod->name;
    revs = mod ? mod->revs : submod->revs;
    latest_revision = mod ? mod->mod->latest_revision : submod->latest_revision;

    if (info->name) {
        /* check name of the parsed model */
        if (strcmp(info->name, name)) {
            LOGERR(ctx, LY_EINVAL, "Unexpected module \"%s\" parsed instead of \"%s\").", name, info->name);
            return LY_EINVAL;
        }
    }
    if (info->revision) {
        /* check revision of the parsed model */
        if (!revs || strcmp(info->revision, revs[0].date)) {
            LOGERR(ctx, LY_EINVAL, "Module \"%s\" parsed with the wrong revision (\"%s\" instead \"%s\").", name,
                    revs ? revs[0].date : "none", info->revision);
            return LY_EINVAL;
        }
    } else if (!latest_revision) {
        /* do not log, we just need to drop the schema and use the latest revision from the context */
        return LY_EEXIST;
    }
    if (submod) {
        assert(info->submoduleof);

        /* check that the submodule belongs-to our module */
        if (strcmp(info->submoduleof, submod->mod->name)) {
            LOGVAL(ctx, LYVE_REFERENCE, "Included \"%s\" submodule from \"%s\" belongs-to a different module \"%s\".",
                    submod->name, info->submoduleof, submod->mod->name);
            return LY_EVALID;
        }
        /* check circular dependency */
        if (submod->parsing) {
            LOGVAL(ctx, LYVE_REFERENCE, "A circular dependency (include) for module \"%s\".", submod->name);
            return LY_EVALID;
        }
    }
    if (info->path) {
        ly_check_module_filename(ctx, name, revs ? revs[0].date : NULL, info->path);
    }
    return LY_SUCCESS;
}